

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_move_uint32_iterator_equalorlarger(roaring_uint32_iterator_t *it,uint32_t val)

{
  roaring_array_t *ra;
  array_container_t *arr;
  uint16_t x;
  _Bool _Var1;
  uint16_t uVar2;
  uint uVar3;
  int iVar4;
  array_container_t *ac;
  
  x = (uint16_t)val;
  ra = &it->parent->high_low_container;
  uVar3 = ra_get_index(ra,(uint16_t)(val >> 0x10));
  if ((int)uVar3 < 0) {
    uVar3 = ~uVar3;
  }
  else {
    uVar2 = container_maximum(ra->containers[uVar3],ra->typecodes[uVar3]);
    if ((val & 0xffff) <= (uint)uVar2) {
      it->container_index = uVar3;
      iter_new_container_partial_init(it);
      arr = (array_container_t *)it->container;
      if (it->typecode == '\x03') {
        iVar4 = run_container_index_equalorlarger((run_container_t *)arr,x);
        it->run_index = iVar4;
        if ((val & 0xffff) < (uint)arr->array[(long)iVar4 * 2]) {
          val = (uint)arr->array[(long)iVar4 * 2] | it->highbits;
        }
      }
      else {
        if (it->typecode == '\x02') {
          iVar4 = array_container_index_equalorlarger(arr,x);
          it->in_container_index = iVar4;
          uVar3 = (uint)arr->array[iVar4];
        }
        else {
          uVar3 = bitset_container_index_equalorlarger((bitset_container_t *)arr,x);
          it->in_container_index = uVar3;
        }
        val = uVar3 | it->highbits;
      }
      it->current_value = val;
      it->has_value = true;
      return true;
    }
    uVar3 = uVar3 + 1;
  }
  it->container_index = uVar3;
  _Var1 = loadfirstvalue(it);
  it->has_value = _Var1;
  return _Var1;
}

Assistant:

bool roaring_move_uint32_iterator_equalorlarger(roaring_uint32_iterator_t *it, uint32_t val) {
    uint16_t hb = val >> 16;
    const int i = ra_get_index(& it->parent->high_low_container, hb);
    if (i >= 0) {
      uint32_t lowvalue = container_maximum(it->parent->high_low_container.containers[i], it->parent->high_low_container.typecodes[i]);
      uint16_t lb = val & 0xFFFF;
      if(lowvalue < lb ) {
        it->container_index = i+1; // will have to load first value of next container
      } else {// the value is necessarily within the range of the container
        it->container_index = i;
        it->has_value = loadfirstvalue_largeorequal(it, val);
        return it->has_value;
      }
    } else {
      // there is no matching, so we are going for the next container
      it->container_index = -i-1;
    }
    it->has_value = loadfirstvalue(it);
    return it->has_value;
}